

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtmem.cpp
# Opt level: O0

int __thiscall
asmjit::_abi_1_10::VirtMem::AnonymousMemory::unlink(AnonymousMemory *this,char *__name)

{
  FileType FVar1;
  uint uVar2;
  char *pcVar3;
  FileType type;
  undefined4 in_stack_fffffffffffffff0;
  
  FVar1 = this->_fileType;
  this->_fileType = kFileTypeNone;
  if (FVar1 == kFileTypeShm) {
    pcVar3 = String::data((String *)CONCAT44(1,in_stack_fffffffffffffff0));
    uVar2 = shm_unlink(pcVar3);
    this = (AnonymousMemory *)(ulong)uVar2;
  }
  else if (FVar1 == kFileTypeTmp) {
    pcVar3 = String::data((String *)CONCAT44(2,in_stack_fffffffffffffff0));
    uVar2 = ::unlink(pcVar3);
    this = (AnonymousMemory *)(ulong)uVar2;
  }
  return (int)this;
}

Assistant:

void unlink() noexcept {
    FileType type = _fileType;
    _fileType = kFileTypeNone;

#ifdef ASMJIT_HAS_SHM_OPEN_AND_UNLINK
    if (type == kFileTypeShm) {
      ::shm_unlink(_tmpName.data());
      return;
    }
#endif

    if (type == kFileTypeTmp) {
      ::unlink(_tmpName.data());
      return;
    }
  }